

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O2

void Aig_RManPrintSigs(Aig_VSig_t *pSigs,int nVars)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  
  uVar1 = 0;
  if (0 < nVars) {
    uVar1 = (ulong)(uint)nVars;
  }
  piVar4 = pSigs->nCofOnes;
  for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    printf("%2d : ",uVar3 & 0xffffffff);
    piVar5 = piVar4;
    for (uVar6 = 0; uVar6 != 2; uVar6 = uVar6 + 1) {
      printf("%5d  ",(ulong)(uint)pSigs[uVar6 | uVar3 * 2].nOnes);
      putchar(0x28);
      for (uVar2 = 0; (uint)nVars != uVar2; uVar2 = uVar2 + 1) {
        printf("%4d ",(ulong)(uint)piVar5[uVar2]);
      }
      printf(")  ");
      piVar5 = piVar5 + 0xd;
    }
    putchar(10);
    piVar4 = piVar4 + 0x1a;
  }
  return;
}

Assistant:

void Aig_RManPrintSigs( Aig_VSig_t * pSigs, int nVars )
{
    int v, i, k;
    for ( v = 0; v < nVars; v++ )
    {
        printf( "%2d : ", v );
        for ( k = 0; k < 2; k++ )
        {
            printf( "%5d  ", pSigs[2*v+k].nOnes );
            printf( "(" );
            for ( i = 0; i < nVars; i++ )
                printf( "%4d ", pSigs[2*v+k].nCofOnes[i] );
            printf( ")  " );
        }
        printf( "\n" );
    }
}